

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O3

TranslatorInfo * __thiscall
helics::TranslatorFederate::createTranslator
          (TranslatorFederate *this,GlobalBrokerId dest,InterfaceHandle handle,string_view key,
          string_view endpointType,string_view units)

{
  BaseType BVar1;
  GlobalFederateId GVar2;
  _Head_base<0UL,_helics::TranslatorInfo_*,_false> this_00;
  GlobalHandle handle_00;
  __uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> local_40;
  GlobalHandle local_38;
  
  BVar1 = (this->mFedID).gid;
  GVar2.gid = dest.gid;
  if ((this->mCoreID).gid == dest.gid) {
    GVar2.gid = BVar1;
  }
  if (dest.gid == 0) {
    GVar2.gid = BVar1;
  }
  this_00._M_head_impl = (TranslatorInfo *)operator_new(0x450);
  handle_00.handle.hid = handle.hid;
  handle_00.fed_id.gid = GVar2.gid;
  TranslatorInfo::TranslatorInfo(this_00._M_head_impl,handle_00,key,endpointType,units);
  local_38 = (this_00._M_head_impl)->id;
  local_40._M_t.
  super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>.
  super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl =
       (tuple<helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>)
       (tuple<helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>)
       this_00._M_head_impl;
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::insert
            (&this->translators,&local_38,
             (unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_> *)
             &local_40);
  if ((_Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
      .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl != (TranslatorInfo *)0x0)
  {
    std::default_delete<helics::TranslatorInfo>::operator()
              ((default_delete<helics::TranslatorInfo> *)&local_40,
               (TranslatorInfo *)
               local_40._M_t.
               super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
               .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl);
  }
  return (_Head_base<0UL,_helics::TranslatorInfo_*,_false>)this_00._M_head_impl;
}

Assistant:

TranslatorInfo* TranslatorFederate::createTranslator(GlobalBrokerId dest,
                                                     InterfaceHandle handle,
                                                     std::string_view key,
                                                     std::string_view endpointType,
                                                     std::string_view units)
{
    auto tran = std::make_unique<TranslatorInfo>(
        GlobalHandle{(dest == parent_broker_id || dest == mCoreID) ? GlobalBrokerId{mFedID} : dest,
                     handle},
        key,
        endpointType,
        units);

    auto cid = tran->id;
    auto* retTarget = tran.get();
    // auto actualKey = key;

    // if (actualKey.empty()) {
    // actualKey = "sFilter_";
    // actualKey.append(std::to_string(handle.baseValue()));
    // }

    // if (filt->core_id == mFedID) {
    translators.insert(cid, std::move(tran));
    //} else {
    // actualKey.push_back('_');
    //  actualKey.append(std::to_string(cid.baseValue()));
    //    filters.insert({cid, handle}, std::move(filt));
    //}

    return retTarget;
}